

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_waveops.cpp
# Opt level: O0

bool dxil_spv::emit_wave_multi_prefix_count_bits_instruction(Impl *impl,CallInst *instruction)

{
  bool bVar1;
  Id IVar2;
  Builder *pBVar3;
  Operation *this;
  Value *pVVar4;
  Operation *op_00;
  Operation *is_helper_lane;
  Id local_48;
  uint i;
  Id ballot [4];
  Operation *op;
  Id call_id;
  Builder *builder;
  CallInst *instruction_local;
  Impl *impl_local;
  
  pBVar3 = Converter::Impl::builder(impl);
  IVar2 = SPIRVModule::get_helper_call_id(impl->spirv_module,WaveMultiPrefixCountBits,0);
  this = Converter::Impl::allocate(impl,OpFunctionCall,(Value *)instruction);
  Operation::add_id(this,IVar2);
  pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  IVar2 = Converter::Impl::get_id_for_value(impl,pVVar4,0);
  Operation::add_id(this,IVar2);
  for (is_helper_lane._4_4_ = 0; is_helper_lane._4_4_ < 4;
      is_helper_lane._4_4_ = is_helper_lane._4_4_ + 1) {
    pVVar4 = LLVMBC::Instruction::getOperand
                       (&instruction->super_Instruction,is_helper_lane._4_4_ + 2);
    IVar2 = Converter::Impl::get_id_for_value(impl,pVVar4,0);
    (&local_48)[is_helper_lane._4_4_] = IVar2;
  }
  IVar2 = spv::Builder::makeUintType(pBVar3,0x20);
  IVar2 = Converter::Impl::build_vector(impl,IVar2,&local_48,4);
  Operation::add_id(this,IVar2);
  if ((((impl->options).nv_subgroup_partition_enabled & 1U) == 0) &&
     (bVar1 = wave_op_needs_helper_lane_masking(impl), bVar1)) {
    pBVar3 = Converter::Impl::builder(impl);
    IVar2 = spv::Builder::makeBoolType(pBVar3);
    op_00 = Converter::Impl::allocate(impl,OpIsHelperInvocationEXT,IVar2);
    Converter::Impl::add(impl,op_00,false);
    Operation::add_id(this,op_00->id);
  }
  Converter::Impl::add(impl,this,false);
  return true;
}

Assistant:

bool emit_wave_multi_prefix_count_bits_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();

	// There is no NV equivalent for this one.

	spv::Id call_id = impl.spirv_module.get_helper_call_id(HelperCall::WaveMultiPrefixCountBits);
	auto *op = impl.allocate(spv::OpFunctionCall, instruction);
	op->add_id(call_id);

	op->add_id(impl.get_id_for_value(instruction->getOperand(1)));

	spv::Id ballot[4];
	for (unsigned i = 0; i < 4; i++)
		ballot[i] = impl.get_id_for_value(instruction->getOperand(2 + i));
	op->add_id(impl.build_vector(builder.makeUintType(32), ballot, 4));

	if (!impl.options.nv_subgroup_partition_enabled &&
	    wave_op_needs_helper_lane_masking(impl))
	{
		auto *is_helper_lane = impl.allocate(spv::OpIsHelperInvocationEXT, impl.builder().makeBoolType());
		impl.add(is_helper_lane);
		op->add_id(is_helper_lane->id);
	}

	impl.add(op);

	return true;
}